

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Test *pTVar5;
  char *__end;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  undefined4 in_register_0000003c;
  bool *pbVar10;
  byte bVar11;
  char *pos;
  uint local_a4;
  string local_98;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 1;
  local_78._M_dataplus._M_p = "gtest_filter";
  local_78._M_string_length._0_4_ = 1;
  local_78._M_string_length._4_4_ = 0;
  iVar2 = getopt_long(CONCAT44(in_register_0000003c,argc),argv,"h",&local_78,0);
  if (iVar2 == -1) {
    pcVar9 = "*";
  }
  else {
    do {
      pcVar9 = _optarg;
      if (((iVar2 != 1) || (pcVar3 = strchr(_optarg,0x3f), pcVar3 != (char *)0x0)) ||
         (pcVar3 = strchr(pcVar9,0x3a), pcVar3 != (char *)0x0)) {
        main_cold_1();
        return 1;
      }
      iVar2 = getopt_long(argc,argv,"h",&local_78,0);
    } while (iVar2 != -1);
  }
  iVar2 = ntests;
  uVar6 = (ulong)ntests;
  if (0 < (long)uVar6) {
    pcVar4 = strchr(pcVar9,0x2d);
    pcVar3 = "*";
    if (pcVar4 != pcVar9) {
      pcVar3 = pcVar9;
    }
    pcVar9 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar9 = pcVar4 + 1;
    }
    lVar7 = 0;
    local_a4 = 0;
    do {
      pcVar4 = *(char **)((long)&tests[0].name + lVar7);
      bVar1 = anon_unknown.dwarf_1ce327::PatternMatchesString(pcVar3,pcVar4);
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_1ce327::PatternMatchesString(pcVar9,pcVar4);
        bVar1 = !bVar1;
        local_a4 = local_a4 + bVar1;
      }
      else {
        bVar1 = false;
      }
      *(bool *)(lVar7 + 0x1fe6a0) = bVar1;
      lVar7 = lVar7 + 0x18;
    } while (uVar6 * 0x18 != lVar7);
    if (0 < iVar2) {
      bVar11 = 1;
      pbVar10 = &tests[0].should_run;
      lVar7 = 0;
      uVar8 = 0;
      do {
        if (*pbVar10 == true) {
          uVar8 = uVar8 + 1;
          pTVar5 = (*((RegisteredTest *)(pbVar10 + -0x10))->factory)();
          (anonymous_namespace)::StringPrintf_abi_cxx11_
                    (&local_98,"[%d/%d] %s",(ulong)uVar8,(ulong)local_a4,*(char **)(pbVar10 + -8));
          LinePrinter::Print(&printer,&local_98,ELIDE);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          (*pTVar5->_vptr_Test[2])(pTVar5);
          (*pTVar5->_vptr_Test[4])(pTVar5);
          (*pTVar5->_vptr_Test[3])(pTVar5);
          bVar11 = bVar11 & (pTVar5->failed_ ^ 1U);
          (*pTVar5->_vptr_Test[1])(pTVar5);
          uVar6 = (ulong)(uint)ntests;
        }
        lVar7 = lVar7 + 1;
        pbVar10 = pbVar10 + 0x18;
      } while (lVar7 < (int)uVar6);
      pcVar9 = "failed\n";
      if (bVar11 != 0) {
        pcVar9 = "passed\n";
      }
      pcVar3 = "failed\n";
      if (bVar11 != 0) {
        pcVar3 = "passed\n";
      }
      uVar8 = (byte)~bVar11 & 1;
      goto LAB_00188d98;
    }
  }
  pcVar3 = "passed\n";
  uVar8 = 0;
  pcVar9 = "passed\n";
LAB_00188d98:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar9,pcVar3 + 7);
  LinePrinter::PrintOnNewLine(&printer,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return uVar8;
}

Assistant:

int main(int argc, char **argv) {
  int tests_started = 0;

  const char* test_filter = "*";
  if (!ReadFlags(&argc, &argv, &test_filter))
    return 1;

  int nactivetests = 0;
  for (int i = 0; i < ntests; i++)
    if ((tests[i].should_run = TestMatchesFilter(tests[i].name, test_filter)))
      ++nactivetests;

  bool passed = true;
  for (int i = 0; i < ntests; i++) {
    if (!tests[i].should_run) continue;

    ++tests_started;
    testing::Test* test = tests[i].factory();
    printer.Print(
        StringPrintf("[%d/%d] %s", tests_started, nactivetests, tests[i].name),
        LinePrinter::ELIDE);
    test->SetUp();
    test->Run();
    test->TearDown();
    if (test->Failed())
      passed = false;
    delete test;
  }

  printer.PrintOnNewLine(passed ? "passed\n" : "failed\n");
  return passed ? EXIT_SUCCESS : EXIT_FAILURE;
}